

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_wav_ds_get_length(ma_data_source *pDataSource,ma_uint64 *pLength)

{
  ma_result mVar1;
  
  mVar1 = MA_INVALID_ARGS;
  if ((pLength != (ma_uint64 *)0x0) && (*pLength = 0, pDataSource != (ma_data_source *)0x0)) {
    *pLength = *(ma_uint64 *)((long)pDataSource + 0xe8);
    mVar1 = MA_SUCCESS;
  }
  return mVar1;
}

Assistant:

static ma_result ma_wav_ds_get_length(ma_data_source* pDataSource, ma_uint64* pLength)
{
    return ma_wav_get_length_in_pcm_frames((ma_wav*)pDataSource, pLength);
}